

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

bool __thiscall tf::Node::_acquire_all(Node *this,SmallVector<tf::Node_*,_2U> *nodes)

{
  Semaphores *pSVar1;
  bool bVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  size_t j;
  ulong uVar6;
  
  pSVar1 = (this->_semaphores)._M_t.
           super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>.
           _M_t.
           super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
           .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
  lVar5 = -8;
  uVar4 = 0;
  while( true ) {
    uVar3 = *(long *)&pSVar1->field_0x8 - *(long *)pSVar1 >> 3;
    if (uVar3 <= uVar4) goto LAB_0011a416;
    bVar2 = Semaphore::_try_acquire_or_wait(*(Semaphore **)(*(long *)pSVar1 + uVar4 * 8),this);
    if (!bVar2) break;
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 8;
  }
  for (uVar6 = 1; uVar6 <= uVar4; uVar6 = uVar6 + 1) {
    Semaphore::_release(*(Semaphore **)(*(long *)pSVar1 + lVar5),nodes);
    lVar5 = lVar5 + -8;
  }
LAB_0011a416:
  return uVar3 <= uVar4;
}

Assistant:

inline bool Node::_acquire_all(SmallVector<Node*>& nodes) {
  // assert(_semaphores != nullptr);
  auto& to_acquire = _semaphores->to_acquire;
  for(size_t i = 0; i < to_acquire.size(); ++i) {
    if(!to_acquire[i]->_try_acquire_or_wait(this)) {
      for(size_t j = 1; j <= i; ++j) {
        to_acquire[i-j]->_release(nodes);
      }
      return false;
    }
  }
  return true;
}